

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

int Kf_SetLoadCuts(Kf_Cut_t *pCuts,int *pIntCuts)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  Kf_Cut_t *pKVar7;
  
  if (*pIntCuts < 1) {
    lVar1 = 0;
  }
  else {
    piVar5 = pIntCuts + 2;
    piVar6 = pCuts->pLeaves;
    lVar1 = 0;
    do {
      pCuts[lVar1].Sign = 0;
      pCuts[lVar1].Polar = 0;
      pCuts[lVar1].iFunc = piVar5[(long)*piVar5 + 1];
      pCuts[lVar1].Delay = piVar5[(long)*piVar5 + 2];
      iVar3 = *piVar5;
      pCuts[lVar1].Area = (float)piVar5[(long)iVar3 + 3];
      pCuts[lVar1].nLeaves = iVar3;
      iVar3 = *piVar5;
      if (0 < iVar3) {
        pKVar7 = pCuts + lVar1;
        lVar4 = 0;
        do {
          if (piVar5[lVar4 + 1] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar2 = (uint)piVar5[lVar4 + 1] >> 1;
          piVar6[lVar4] = uVar2;
          pKVar7->Sign = pKVar7->Sign | 1L << ((byte)uVar2 & 0x3f);
          if (piVar5[lVar4 + 1] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          if ((piVar5[lVar4 + 1] & 1U) != 0) {
            pKVar7->Polar = pKVar7->Polar | 1 << ((byte)lVar4 & 0x1f);
          }
          lVar4 = lVar4 + 1;
          iVar3 = *piVar5;
        } while (lVar4 < iVar3);
      }
      lVar1 = lVar1 + 1;
      piVar5 = piVar5 + (long)iVar3 + 4;
      piVar6 = piVar6 + 0x18;
    } while (lVar1 < *pIntCuts);
  }
  return (int)lVar1;
}

Assistant:

static inline int Kf_SetLoadCuts( Kf_Cut_t * pCuts, int * pIntCuts )
{
    Kf_Cut_t * pCut;
    int k, * pIntCut, nCuts = 0; 
    Kf_ObjForEachCutInt( pIntCuts, pIntCut, nCuts )
    {
        pCut = pCuts + nCuts;
        pCut->Sign  = 0;
        pCut->Polar = 0;
        pCut->iFunc = pIntCut[pIntCut[0] + 1];
        pCut->Delay = pIntCut[pIntCut[0] + 2];
        pCut->Area  = Abc_Int2Float(pIntCut[pIntCut[0] + 3]);
        pCut->nLeaves = pIntCut[0];    
        for ( k = 0; k < pIntCut[0]; k++ )
        {
            pCut->pLeaves[k] = Abc_Lit2Var(pIntCut[k+1]);
            pCut->Sign |= ((word)1) << (pCut->pLeaves[k] & 0x3F);
            if ( Abc_LitIsCompl(pIntCut[k+1]) )
                pCut->Polar |= (1 << k);
        }
    }
    return nCuts;
}